

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cloud.c
# Opt level: O0

void Cloud_bddPrintCube(CloudManager *dd,CloudNode *bCube)

{
  CloudNode *local_28;
  CloudNode *bCube1;
  CloudNode *bCube0;
  CloudNode *bCube_local;
  CloudManager *dd_local;
  
  bCube0 = bCube;
  if ((*(uint *)(((ulong)bCube & 0xfffffffffffffffe) + 4) & 0xefffffff) == 0xfffffff) {
    __assert_fail("!Cloud_IsConstant(bCube)",
                  "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/bool/kit/cloud.c"
                  ,0x388,"void Cloud_bddPrintCube(CloudManager *, CloudNode *)");
  }
  while( true ) {
    while( true ) {
      if ((*(uint *)(((ulong)bCube0 & 0xfffffffffffffffe) + 4) & 0xefffffff) == 0xfffffff) {
        return;
      }
      if (((ulong)bCube0 & 1) == 0) {
        bCube1 = bCube0->e;
        local_28 = bCube0->t;
      }
      else {
        bCube1 = (CloudNode *)((ulong)bCube0->e ^ 1);
        local_28 = (CloudNode *)((ulong)bCube0->t ^ 1);
      }
      if (bCube1 != dd->zero) break;
      if (local_28 == dd->zero) {
        __assert_fail("bCube1 != dd->zero",
                      "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/bool/kit/cloud.c"
                      ,0x3a3,"void Cloud_bddPrintCube(CloudManager *, CloudNode *)");
      }
      printf("[%d]",(ulong)bCube0->v);
      bCube0 = local_28;
    }
    if (local_28 != dd->zero) break;
    printf("[%d]\'",(ulong)bCube0->v);
    bCube0 = bCube1;
  }
  __assert_fail("bCube1 == dd->zero",
                "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/bool/kit/cloud.c"
                ,0x39d,"void Cloud_bddPrintCube(CloudManager *, CloudNode *)");
}

Assistant:

void Cloud_bddPrintCube( CloudManager * dd, CloudNode * bCube )
{
	CloudNode * bCube0, * bCube1;

	assert( !Cloud_IsConstant(bCube) );
	while ( 1 )
	{
		// get the node structure
		if ( Cloud_IsConstant(bCube) )
			break;

		// cofactor the cube
		if ( Cloud_IsComplement(bCube) )
		{
			bCube0 = Cloud_Not( cloudE(bCube) );
			bCube1 = Cloud_Not( cloudT(bCube) );
		}
		else
		{
			bCube0 = cloudE(bCube);
			bCube1 = cloudT(bCube);
		}

		if ( bCube0 != dd->zero )
		{
			assert( bCube1 == dd->zero );
			printf( "[%d]'", cloudV(bCube) );
			bCube = bCube0;
		}
		else
		{
			assert( bCube1 != dd->zero );
			printf( "[%d]", cloudV(bCube) );
			bCube = bCube1;
		}
	}
}